

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

size_t __thiscall cnn::Max::aux_storage_size(Max *this)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  ushort uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  int iVar17;
  
  uVar7 = (ulong)(this->super_Node).dim.nd;
  if (uVar7 == 0) {
    iVar17 = 1;
  }
  else {
    auVar11 = vpbroadcastq_avx512f();
    auVar12 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar8 = 0;
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar15 = vmovdqa64_avx512f(auVar12);
      auVar12 = vpbroadcastq_avx512f();
      auVar16 = vporq_avx512f(auVar12,auVar13);
      auVar12 = vporq_avx512f(auVar12,auVar14);
      uVar4 = vpcmpuq_avx512f(auVar12,auVar11,2);
      bVar5 = (byte)uVar4;
      uVar4 = vpcmpuq_avx512f(auVar16,auVar11,2);
      bVar6 = (byte)uVar4;
      uVar9 = CONCAT11(bVar6,bVar5);
      auVar12 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this->super_Node).dim.d + uVar8));
      auVar16._4_4_ = (uint)((byte)(uVar9 >> 1) & 1) * auVar12._4_4_;
      auVar16._0_4_ = (uint)(bVar5 & 1) * auVar12._0_4_;
      auVar16._8_4_ = (uint)((byte)(uVar9 >> 2) & 1) * auVar12._8_4_;
      auVar16._12_4_ = (uint)((byte)(uVar9 >> 3) & 1) * auVar12._12_4_;
      auVar16._16_4_ = (uint)((byte)(uVar9 >> 4) & 1) * auVar12._16_4_;
      auVar16._20_4_ = (uint)((byte)(uVar9 >> 5) & 1) * auVar12._20_4_;
      auVar16._24_4_ = (uint)((byte)(uVar9 >> 6) & 1) * auVar12._24_4_;
      auVar16._28_4_ = (uint)((byte)(uVar9 >> 7) & 1) * auVar12._28_4_;
      auVar16._32_4_ = (uint)(bVar6 & 1) * auVar12._32_4_;
      auVar16._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar12._36_4_;
      auVar16._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar12._40_4_;
      auVar16._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar12._44_4_;
      auVar16._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar12._48_4_;
      auVar16._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar12._52_4_;
      auVar16._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar12._56_4_;
      auVar16._60_4_ = (uint)(bVar6 >> 7) * auVar12._60_4_;
      auVar12 = vpmulld_avx512f(auVar16,auVar15);
      uVar8 = uVar8 + 0x10;
    } while ((uVar7 + 0xf & 0xfffffffffffffff0) != uVar8);
    auVar11 = vmovdqa32_avx512f(auVar12);
    auVar12._0_4_ = (uint)(bVar5 & 1) * auVar11._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar15._0_4_;
    bVar1 = (bool)((byte)(uVar9 >> 1) & 1);
    auVar12._4_4_ = (uint)bVar1 * auVar11._4_4_ | (uint)!bVar1 * auVar15._4_4_;
    bVar1 = (bool)((byte)(uVar9 >> 2) & 1);
    auVar12._8_4_ = (uint)bVar1 * auVar11._8_4_ | (uint)!bVar1 * auVar15._8_4_;
    bVar1 = (bool)((byte)(uVar9 >> 3) & 1);
    auVar12._12_4_ = (uint)bVar1 * auVar11._12_4_ | (uint)!bVar1 * auVar15._12_4_;
    bVar1 = (bool)((byte)(uVar9 >> 4) & 1);
    auVar12._16_4_ = (uint)bVar1 * auVar11._16_4_ | (uint)!bVar1 * auVar15._16_4_;
    bVar1 = (bool)((byte)(uVar9 >> 5) & 1);
    auVar12._20_4_ = (uint)bVar1 * auVar11._20_4_ | (uint)!bVar1 * auVar15._20_4_;
    bVar1 = (bool)((byte)(uVar9 >> 6) & 1);
    auVar12._24_4_ = (uint)bVar1 * auVar11._24_4_ | (uint)!bVar1 * auVar15._24_4_;
    bVar1 = (bool)((byte)(uVar9 >> 7) & 1);
    auVar12._28_4_ = (uint)bVar1 * auVar11._28_4_ | (uint)!bVar1 * auVar15._28_4_;
    auVar12._32_4_ = (uint)(bVar6 & 1) * auVar11._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar15._32_4_;
    bVar1 = (bool)(bVar6 >> 1 & 1);
    auVar12._36_4_ = (uint)bVar1 * auVar11._36_4_ | (uint)!bVar1 * auVar15._36_4_;
    bVar1 = (bool)(bVar6 >> 2 & 1);
    auVar12._40_4_ = (uint)bVar1 * auVar11._40_4_ | (uint)!bVar1 * auVar15._40_4_;
    bVar1 = (bool)(bVar6 >> 3 & 1);
    auVar12._44_4_ = (uint)bVar1 * auVar11._44_4_ | (uint)!bVar1 * auVar15._44_4_;
    bVar1 = (bool)(bVar6 >> 4 & 1);
    auVar12._48_4_ = (uint)bVar1 * auVar11._48_4_ | (uint)!bVar1 * auVar15._48_4_;
    bVar1 = (bool)(bVar6 >> 5 & 1);
    auVar12._52_4_ = (uint)bVar1 * auVar11._52_4_ | (uint)!bVar1 * auVar15._52_4_;
    bVar1 = (bool)(bVar6 >> 6 & 1);
    auVar12._56_4_ = (uint)bVar1 * auVar11._56_4_ | (uint)!bVar1 * auVar15._56_4_;
    auVar12._60_4_ =
         (uint)(bVar6 >> 7) * auVar11._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar15._60_4_;
    auVar10 = vextracti64x4_avx512f(auVar12,1);
    auVar11 = vpmulld_avx512f(auVar12,ZEXT3264(auVar10));
    auVar2 = vpmulld_avx(auVar11._0_16_,auVar11._16_16_);
    auVar3 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    auVar3 = vpshufd_avx(auVar2,0x55);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    iVar17 = auVar2._0_4_;
  }
  return (ulong)(iVar17 * (this->super_Node).dim.bd) << 2;
}

Assistant:

size_t Max::aux_storage_size() const {
  return dim.size() * sizeof(float);
}